

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzquadraticquad.cpp
# Opt level: O2

int __thiscall pzgeom::TPZQuadraticQuad::ClassId(TPZQuadraticQuad *this)

{
  uint uVar1;
  int iVar2;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"TPZQuadraticQuad",&local_39);
  uVar1 = Hash(&local_38);
  iVar2 = TPZNodeRep<8,_pztopology::TPZQuadrilateral>::ClassId
                    (&this->super_TPZNodeRep<8,_pztopology::TPZQuadrilateral>);
  std::__cxx11::string::~string((string *)&local_38);
  return iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZQuadraticQuad::ClassId() const{
    return Hash("TPZQuadraticQuad") ^ pzgeom::TPZNodeRep<8,pztopology::TPZQuadrilateral>::ClassId() << 1;
}